

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnlabeledValueArg.h
# Opt level: O0

bool __thiscall
TCLAP::
UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator==(UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,Arg *a)

{
  __type _Var1;
  string *__rhs;
  __type local_42;
  undefined1 local_40 [40];
  Arg *a_local;
  UnlabeledValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_40._32_8_ = a;
  a_local = (Arg *)this;
  __rhs = Arg::getName_abi_cxx11_(a);
  _Var1 = std::operator==(&(this->
                           super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).super_Arg._name,__rhs);
  local_42 = true;
  if (!_Var1) {
    Arg::getDescription_abi_cxx11_((Arg *)local_40);
    local_42 = std::operator==(&(this->
                                super_ValueArg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ).super_Arg._description,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return local_42 != false;
}

Assistant:

bool UnlabeledValueArg<T>::operator==(const Arg& a ) const
{
	if ( _name == a.getName() || _description == a.getDescription() )
		return true;
	else
		return false;
}